

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall
enact::Options::Options
          (Options *this,string *filename,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *programArgs,
          unordered_set<enact::Flag,_std::hash<enact::Flag>,_std::equal_to<enact::Flag>,_std::allocator<enact::Flag>_>
          *flags)

{
  initializer_list<enact::Flag> __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>
  __l_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  *local_418;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>
  local_39d;
  key_equal local_39c;
  hasher local_39b;
  undefined1 local_39a;
  allocator<enact::Flag> local_399;
  Flag local_398 [6];
  iterator local_380;
  size_type local_378;
  vector<enact::Flag,_std::allocator<enact::Flag>_> local_370;
  Options *local_358;
  code *local_350;
  undefined8 local_348;
  type local_340;
  Flag local_30c;
  Options *local_308;
  code *local_300;
  undefined8 local_2f8;
  type local_2f0;
  Flag local_2cc;
  Options *local_2c8;
  code *local_2c0;
  undefined8 local_2b8;
  type local_2b0;
  Flag local_28c;
  Options *local_288;
  code *local_280;
  undefined8 local_278;
  type local_270;
  Flag local_24c;
  Options *local_248;
  code *local_240;
  undefined8 local_238;
  type local_230;
  Flag local_1fc;
  Options *local_1f8;
  code *local_1f0;
  undefined8 local_1e8;
  type local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  *local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_78;
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  unordered_set<enact::Flag,_std::hash<enact::Flag>,_std::equal_to<enact::Flag>,_std::allocator<enact::Flag>_>
  *flags_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *programArgs_local;
  string *filename_local;
  Options *this_local;
  
  local_28 = (undefined1  [8])flags;
  flags_local = (unordered_set<enact::Flag,_std::hash<enact::Flag>,_std::equal_to<enact::Flag>,_std::allocator<enact::Flag>_>
                 *)programArgs;
  programArgs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)filename;
  filename_local = &this->m_filename;
  std::__cxx11::string::string((string *)this,(string *)filename);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_programArgs,programArgs);
  std::
  unordered_set<enact::Flag,_std::hash<enact::Flag>,_std::equal_to<enact::Flag>,_std::allocator<enact::Flag>_>
  ::unordered_set(&this->m_flags,flags);
  local_39a = 1;
  local_1c0 = &local_1b8;
  local_1f0 = enableFlag;
  local_1e8 = 0;
  local_1fc = DEBUG_PRINT_AST;
  local_1f8 = this;
  std::bind<void(enact::Options::*)(enact::Flag),enact::Options*,enact::Flag>
            (&local_1e0,(offset_in_Options_to_subr *)&local_1f0,&local_1f8,&local_1fc);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[18],_std::_Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)>,_true>
            (&local_1b8,(char (*) [18])"--debug-print-ast",&local_1e0);
  local_240 = enableFlag;
  local_238 = 0;
  local_24c = DEBUG_DISASSEMBLE_CHUNK;
  local_248 = this;
  local_1c0 = &local_178;
  std::bind<void(enact::Options::*)(enact::Flag),enact::Options*,enact::Flag>
            (&local_230,(offset_in_Options_to_subr *)&local_240,&local_248,&local_24c);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[26],_std::_Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)>,_true>
            (&local_178,(char (*) [26])"--debug-disassemble-chunk",&local_230);
  local_280 = enableFlag;
  local_278 = 0;
  local_28c = DEBUG_TRACE_EXECUTION;
  local_288 = this;
  local_1c0 = &local_138;
  std::bind<void(enact::Options::*)(enact::Flag),enact::Options*,enact::Flag>
            (&local_270,(offset_in_Options_to_subr *)&local_280,&local_288,&local_28c);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[24],_std::_Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)>,_true>
            (&local_138,(char (*) [24])"--debug-trace-execution",&local_270);
  local_2c0 = enableFlag;
  local_2b8 = 0;
  local_2cc = DEBUG_STRESS_GC;
  local_2c8 = this;
  local_1c0 = &local_f8;
  std::bind<void(enact::Options::*)(enact::Flag),enact::Options*,enact::Flag>
            (&local_2b0,(offset_in_Options_to_subr *)&local_2c0,&local_2c8,&local_2cc);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[18],_std::_Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)>,_true>
            (&local_f8,(char (*) [18])"--debug-stress-gc",&local_2b0);
  local_300 = enableFlag;
  local_2f8 = 0;
  local_30c = DEBUG_LOG_GC;
  local_308 = this;
  local_1c0 = &local_b8;
  std::bind<void(enact::Options::*)(enact::Flag),enact::Options*,enact::Flag>
            (&local_2f0,(offset_in_Options_to_subr *)&local_300,&local_308,&local_30c);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[15],_std::_Bind<void_(enact::Options::*(enact::Options_*,_enact::Flag))(enact::Flag)>,_true>
            (&local_b8,(char (*) [15])"--debug-log-gc",&local_2f0);
  local_350 = enableFlags;
  local_348 = 0;
  local_398[0] = DEBUG_PRINT_AST;
  local_398[1] = DEBUG_DISASSEMBLE_CHUNK;
  local_398[2] = DEBUG_TRACE_EXECUTION;
  local_398[3] = DEBUG_STRESS_GC;
  local_398[4] = 4;
  local_380 = local_398;
  local_378 = 5;
  local_358 = this;
  local_1c0 = &local_78;
  std::allocator<enact::Flag>::allocator(&local_399);
  __l._M_len = local_378;
  __l._M_array = local_380;
  std::vector<enact::Flag,_std::allocator<enact::Flag>_>::vector(&local_370,__l,&local_399);
  std::
  bind<void(enact::Options::*)(std::vector<enact::Flag,std::allocator<enact::Flag>>),enact::Options*,std::vector<enact::Flag,std::allocator<enact::Flag>>>
            (&local_340,(offset_in_Options_to_subr *)&local_350,&local_358,&local_370);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  ::
  pair<const_char_(&)[8],_std::_Bind<void_(enact::Options::*(enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>))(std::vector<enact::Flag,_std::allocator<enact::Flag>_>)>,_true>
            (&local_78,(char (*) [8])"--debug",&local_340);
  local_39a = 0;
  local_38 = &local_1b8;
  local_30 = 6;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>
  ::allocator(&local_39d);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ::unordered_map(&this->m_parseTable,__l_00,0,&local_39b,&local_39c,&local_39d);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>
  ::~allocator(&local_39d);
  local_418 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
               *)&local_38;
  do {
    local_418 = local_418 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
    ::~pair(local_418);
  } while (local_418 != &local_1b8);
  std::
  _Bind<void_(enact::Options::*(enact::Options_*,_std::vector<enact::Flag,_std::allocator<enact::Flag>_>))(std::vector<enact::Flag,_std::allocator<enact::Flag>_>)>
  ::~_Bind(&local_340);
  std::vector<enact::Flag,_std::allocator<enact::Flag>_>::~vector(&local_370);
  std::allocator<enact::Flag>::~allocator(&local_399);
  return;
}

Assistant:

Options::Options(std::string filename, std::vector<std::string> programArgs, std::unordered_set<Flag> flags) :
            m_filename{std::move(filename)},
            m_programArgs{std::move(programArgs)},
            m_flags{std::move(flags)} {
    }